

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckTable(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  TidyTagId TVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Bool BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ctmbstr ptVar10;
  Node *pNVar11;
  ctmbstr cp;
  char *pcVar12;
  Node *pNVar13;
  tmbchar *ptVar14;
  uint uVar15;
  tmbstr str;
  AttVal *pAVar16;
  
  iVar8 = (doc->access).PRIORITYCHK;
  bVar3 = true;
  if (iVar8 == 3) {
    pAVar16 = node->attributes;
    if (pAVar16 != (AttVal *)0x0) {
      bVar3 = false;
      do {
        if ((pAVar16->dict == (Attribute *)0x0) || (pAVar16->dict->id != TidyAttr_SUMMARY))
        goto LAB_00154833;
        pcVar12 = pAVar16->value;
        uVar15 = 0x2c9;
        if (pcVar12 == (char *)0x0) {
LAB_00154820:
          prvTidyReportAccessError(doc,node,uVar15);
          bVar3 = true;
        }
        else {
          do {
            if (*pcVar12 == '\0') goto LAB_001547da;
            BVar6 = prvTidyIsWhite((int)*pcVar12);
            pcVar12 = pcVar12 + 1;
          } while (BVar6 != no);
          if (pAVar16->value == (ctmbstr)0x0) goto LAB_00154820;
          ptVar10 = prvTidytmbsubstr(pAVar16->value,"summary");
          bVar3 = true;
          if (ptVar10 != (ctmbstr)0x0) {
            if (pAVar16->value == (ctmbstr)0x0) goto LAB_00154820;
            ptVar10 = prvTidytmbsubstr(pAVar16->value,"table");
            if (ptVar10 != (ctmbstr)0x0) {
              prvTidyReportAccessError(doc,node,0x2cb);
            }
          }
LAB_001547da:
          if ((pAVar16->value == (ctmbstr)0x0) ||
             (uVar7 = prvTidytmbstrlen(pAVar16->value), uVar7 == 0)) goto LAB_00154820;
          pcVar12 = pAVar16->value;
          if (pcVar12 == (char *)0x0) {
            str = (ctmbstr)0x0;
LAB_00154812:
            uVar7 = prvTidytmbstrlen(str);
            uVar15 = 0x2ca;
            if (uVar7 != 0) goto LAB_00154820;
          }
          else {
            do {
              if (*pcVar12 == '\0') {
                str = pAVar16->value;
                goto LAB_00154812;
              }
              BVar6 = prvTidyIsWhite((int)*pcVar12);
              pcVar12 = pcVar12 + 1;
            } while (BVar6 != no);
          }
        }
LAB_00154833:
        pAVar16 = pAVar16->next;
      } while (pAVar16 != (AttVal *)0x0);
      bVar3 = !bVar3;
    }
    if (node->content == (Node *)0x0) {
      uVar15 = 0x2c1;
      goto LAB_00154b7c;
    }
    iVar8 = (doc->access).PRIORITYCHK;
  }
  if ((0xfffffffc < iVar8 - 4U) && (pNVar11 = node->content, pNVar11 != (Node *)0x0)) {
    bVar5 = true;
    bVar4 = true;
    do {
      if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_TR)) {
        for (pNVar13 = pNVar11->content; pNVar13 != (Node *)0x0; pNVar13 = pNVar13->next) {
          if ((pNVar13->tag != (Dict *)0x0) && (pNVar13->tag->id == TidyTag_TH)) {
            for (pAVar16 = pNVar13->attributes; pAVar16 != (AttVal *)0x0; pAVar16 = pAVar16->next) {
              if (pAVar16->dict != (Attribute *)0x0) {
                TVar1 = pAVar16->dict->id;
                if (TVar1 == TidyAttr_ROWSPAN) {
                  iVar8 = atoi(pAVar16->value);
                  if (1 < iVar8) {
                    bVar4 = false;
                  }
                }
                else if ((TVar1 == TidyAttr_COLSPAN) && (iVar8 = atoi(pAVar16->value), 1 < iVar8)) {
                  bVar5 = false;
                }
              }
            }
          }
        }
      }
      pNVar11 = pNVar11->next;
    } while (pNVar11 != (Node *)0x0);
    if (!bVar4) {
      prvTidyReportAccessError(doc,node,0x2c5);
      prvTidyDialogue(doc,0x20a);
    }
    if (!bVar5) {
      prvTidyReportAccessError(doc,node,0x2c4);
      prvTidyDialogue(doc,0x20a);
    }
  }
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pNVar11 = node->content;
    if ((((pNVar11 == (Node *)0x0) || (pNVar11->tag == (Dict *)0x0)) ||
        (pNVar11->tag->id != TidyTag_CAPTION)) ||
       ((pNVar11->content == (Node *)0x0 || (pNVar11->content->tag != (Dict *)0x0)))) {
LAB_001549a2:
      prvTidyReportAccessError(doc,node,0x2cc);
    }
    else {
      ptVar14 = (doc->access).textNode;
      memset(&(doc->access).counter,0,0x84);
      getTextNode(doc,pNVar11->content);
      do {
        if (*ptVar14 == '\0') goto LAB_001549a2;
        BVar6 = prvTidyIsWhite((int)*ptVar14);
        ptVar14 = ptVar14 + 1;
      } while (BVar6 != no);
    }
  }
  pNVar11 = node->content;
  if (((pNVar11 != (Node *)0x0) && (pNVar11->tag != (Dict *)0x0)) &&
     ((TVar2 = pNVar11->tag->id, TVar2 == TidyTag_TR ||
      ((((TVar2 == TidyTag_CAPTION && (pNVar11 = pNVar11->next, pNVar11 != (Node *)0x0)) &&
        (pNVar11->tag != (Dict *)0x0)) && (pNVar11->tag->id == TidyTag_TR)))))) {
    CheckColumns(doc,pNVar11);
  }
  if (((((doc->access).HasValidColumnHeaders == no) &&
       (pNVar11 = node->content, pNVar11 != (Node *)0x0)) && (pNVar11->tag != (Dict *)0x0)) &&
     ((TVar2 = pNVar11->tag->id, TVar2 == TidyTag_TR ||
      (((TVar2 == TidyTag_CAPTION && (pNVar11 = pNVar11->next, pNVar11 != (Node *)0x0)) &&
       ((pNVar11->tag != (Dict *)0x0 && (pNVar11->tag->id == TidyTag_TR)))))))) {
    CheckRows(doc,pNVar11);
  }
  uVar9 = (doc->access).PRIORITYCHK;
  if ((bool)(uVar9 == 3 & bVar3)) {
    prvTidyReportAccessError(doc,node,0x2c8);
    uVar9 = (doc->access).PRIORITYCHK;
  }
  if ((uVar9 & 0xfffffffe) == 2) {
    pNVar11 = node->content;
    if (pNVar11 != (Node *)0x0) {
      iVar8 = 0;
      do {
        if (pNVar11->tag != (Dict *)0x0) {
          iVar8 = iVar8 + (uint)(pNVar11->tag->id == TidyTag_TR);
        }
        pNVar11 = pNVar11->next;
      } while (pNVar11 != (Node *)0x0);
      if (iVar8 == 1) {
        prvTidyReportAccessError(doc,node,0x2c6);
      }
    }
    if ((doc->access).HasTH != no) {
      prvTidyReportAccessError(doc,node,0x2c7);
    }
  }
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && ((doc->access).CheckedHeaders == 2)) {
    if ((((doc->access).HasValidRowHeaders == no) &&
        (((((doc->access).HasValidColumnHeaders != no || ((doc->access).HasInvalidRowHeader != no))
          || ((doc->access).HasInvalidColumnHeader != no)) ||
         (prvTidyReportAccessError(doc,node,0x2c1), (doc->access).HasValidRowHeaders == no)))) &&
       ((doc->access).HasInvalidRowHeader != no)) {
      prvTidyReportAccessError(doc,node,0x2c3);
    }
    if (((doc->access).HasValidColumnHeaders == no) && ((doc->access).HasInvalidColumnHeader != no))
    {
      uVar15 = 0x2c2;
LAB_00154b7c:
      prvTidyReportAccessError(doc,node,uVar15);
      return;
    }
  }
  return;
}

Assistant:

static void CheckTable( TidyDocImpl* doc, Node* node )
{
    Node* TNode;
    Node* temp;

    tmbstr word = NULL;

    int numTR = 0;

    Bool HasSummary = no;
    Bool HasCaption = no;

    if (Level3_Enabled( doc ))
    {
        AttVal* av;
        /* Table must have a 'SUMMARY' describing the purpose of the table */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsSUMMARY(av) )
            {
                if ( hasValue(av) )
                {
                    HasSummary = yes;

                    if (AttrContains(av, "summary") && 
                        AttrContains(av, "table"))
                    {
                        TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_PLACEHOLDER );
                    }
                }

                if ( av->value == NULL || TY_(tmbstrlen)(av->value) == 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_NULL );
                }
                else if ( IsWhitespace(av->value) && TY_(tmbstrlen)(av->value) > 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_SPACES );
                }
            }
        }

        /* TABLE must have content. */
        if (node->content == NULL)
        {
            TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
        
            return;
        }
    }

    if (Level1_Enabled( doc ))
    {
        /* Checks for multiple headers */
        CheckMultiHeaders( doc, node );
    }
    
    if (Level2_Enabled( doc ))
    {
        /* Table must have a CAPTION describing the purpose of the table */
        if ( nodeIsCAPTION(node->content) )
        {
            TNode = node->content;

            if (TNode->content && TNode->content->tag == NULL)
            {
                word = getTextNodeClear( doc, TNode);
            }

            if ( !IsWhitespace(word) )
            {
                HasCaption = yes;
            }
        }

        if (HasCaption == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_CAPTION);
        }
    }

    
    if (node->content != NULL)
    {
        if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
        {
            CheckColumns( doc, node->content->next );
        }
        else if ( nodeIsTR(node->content) )
        {
            CheckColumns( doc, node->content );
        }
    }
    
    if ( ! doc->access.HasValidColumnHeaders )
    {
        if (node->content != NULL)
        {
            if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
            {
                CheckRows( doc, node->content->next);
            }
            else if ( nodeIsTR(node->content) )
            {
                CheckRows( doc, node->content);
            }
        }
    }
    
    
    if (Level3_Enabled( doc ))
    {
        /* Suppress warning for missing 'SUMMARY for HTML 2.0 and HTML 3.2 */
        if (HasSummary == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_SUMMARY);
        }
    }

    if (Level2_Enabled( doc ))
    {
        if (node->content != NULL)
        {
            temp = node->content;

            while (temp != NULL)
            {
                if ( nodeIsTR(temp) )
                {
                    numTR++;
                }

                temp = temp->next;
            }

            if (numTR == 1)
            {
                TY_(ReportAccessError)( doc, node, LAYOUT_TABLES_LINEARIZE_PROPERLY);
            }
        }
    
        if ( doc->access.HasTH )
        {
            TY_(ReportAccessError)( doc, node, LAYOUT_TABLE_INVALID_MARKUP);
        }
    }

    if (Level1_Enabled( doc ))
    {
        if ( doc->access.CheckedHeaders == 2 )
        {
            if ( !doc->access.HasValidRowHeaders &&
                 !doc->access.HasValidColumnHeaders &&
                 !doc->access.HasInvalidRowHeader &&
                 !doc->access.HasInvalidColumnHeader  )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
            }

            if ( !doc->access.HasValidRowHeaders && 
                 doc->access.HasInvalidRowHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_ROW);
            }

            if ( !doc->access.HasValidColumnHeaders &&
                 doc->access.HasInvalidColumnHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_COLUMN);
            }
        }
    }
}